

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

void absl::lts_20250127::str_format_internal::anon_unknown_0::FinalPrint
               (FormatState *state,string_view data,size_t padding_offset,size_t trailing_zeros,
               string_view data_postfix)

{
  FormatSinkImpl *pFVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view data_local;
  Padding padding;
  
  data_local._M_str = data._M_str;
  data_local._M_len = data._M_len;
  if (-1 < state->conv->width_) {
    ExtraWidthToPadding(&padding,(data_local._M_len + trailing_zeros + data_postfix._M_len + 1) -
                                 (ulong)(state->sign_char == '\0'),state);
    FormatSinkImpl::Append(state->sink,padding.left_spaces,' ');
    if (state->sign_char != '\0') {
      FormatSinkImpl::Append(state->sink,1,state->sign_char);
    }
    pFVar1 = state->sink;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&data_local,0,padding_offset);
    FormatSinkImpl::Append(pFVar1,bVar2);
    FormatSinkImpl::Append(state->sink,padding.zeros,'0');
    pFVar1 = state->sink;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&data_local,padding_offset,0xffffffffffffffff);
    FormatSinkImpl::Append(pFVar1,bVar2);
    FormatSinkImpl::Append(state->sink,trailing_zeros,'0');
    FormatSinkImpl::Append(state->sink,data_postfix);
    FormatSinkImpl::Append(state->sink,padding.right_spaces,' ');
    return;
  }
  if (state->sign_char != '\0') {
    FormatSinkImpl::Append(state->sink,1,state->sign_char);
  }
  FormatSinkImpl::Append(state->sink,data);
  FormatSinkImpl::Append(state->sink,trailing_zeros,'0');
  FormatSinkImpl::Append(state->sink,data_postfix);
  return;
}

Assistant:

void FinalPrint(const FormatState& state,
                absl::string_view data,
                size_t padding_offset,
                size_t trailing_zeros,
                absl::string_view data_postfix) {
  if (state.conv.width() < 0) {
    // No width specified. Fast-path.
    if (state.sign_char != '\0') state.sink->Append(1, state.sign_char);
    state.sink->Append(data);
    state.sink->Append(trailing_zeros, '0');
    state.sink->Append(data_postfix);
    return;
  }

  auto padding =
      ExtraWidthToPadding((state.sign_char != '\0' ? 1 : 0) + data.size() +
                              data_postfix.size() + trailing_zeros,
                          state);

  state.sink->Append(padding.left_spaces, ' ');
  if (state.sign_char != '\0') state.sink->Append(1, state.sign_char);
  // Padding in general needs to be inserted somewhere in the middle of `data`.
  state.sink->Append(data.substr(0, padding_offset));
  state.sink->Append(padding.zeros, '0');
  state.sink->Append(data.substr(padding_offset));
  state.sink->Append(trailing_zeros, '0');
  state.sink->Append(data_postfix);
  state.sink->Append(padding.right_spaces, ' ');
}